

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveVCProcess.cpp
# Opt level: O0

bool __thiscall Assimp::RemoveVCProcess::ProcessMesh(RemoveVCProcess *this,aiMesh *pMesh)

{
  uint uVar1;
  bool bVar2;
  uint local_34;
  uint local_30;
  uint a_1;
  uint real_1;
  uint i_1;
  uint a;
  uint real;
  uint i;
  bool b;
  bool ret;
  aiMesh *pMesh_local;
  RemoveVCProcess *this_local;
  
  real._3_1_ = false;
  if ((this->configDeleteFlags & 0x800) != 0) {
    pMesh->mMaterialIndex = 0;
  }
  if (((this->configDeleteFlags & 2) != 0) && (pMesh->mNormals != (aiVector3D *)0x0)) {
    if (pMesh->mNormals != (aiVector3D *)0x0) {
      operator_delete__(pMesh->mNormals);
    }
    pMesh->mNormals = (aiVector3D *)0x0;
    real._3_1_ = true;
  }
  if (((this->configDeleteFlags & 4) != 0) && (pMesh->mTangents != (aiVector3D *)0x0)) {
    if (pMesh->mTangents != (aiVector3D *)0x0) {
      operator_delete__(pMesh->mTangents);
    }
    pMesh->mTangents = (aiVector3D *)0x0;
    if (pMesh->mBitangents != (aiVector3D *)0x0) {
      operator_delete__(pMesh->mBitangents);
    }
    pMesh->mBitangents = (aiVector3D *)0x0;
    real._3_1_ = true;
  }
  bVar2 = (this->configDeleteFlags & 0x10) != 0;
  a = 0;
  i_1 = 0;
  while ((i_1 < 8 && (pMesh->mTextureCoords[a] != (aiVector3D *)0x0))) {
    if (((this->configDeleteFlags & 1 << ((char)i_1 + 0x19U & 0x1f)) != 0) || (bVar2)) {
      if (pMesh->mTextureCoords[a] != (aiVector3D *)0x0) {
        operator_delete__(pMesh->mTextureCoords[a]);
      }
      pMesh->mTextureCoords[a] = (aiVector3D *)0x0;
      real._3_1_ = true;
      uVar1 = a;
      if (bVar2) goto LAB_005c1554;
      while (real_1 = uVar1 + 1, real_1 < 8) {
        pMesh->mTextureCoords[uVar1] = pMesh->mTextureCoords[real_1];
        uVar1 = real_1;
      }
      pMesh->mTextureCoords[7] = (aiVector3D *)0x0;
    }
    else {
LAB_005c1554:
      a = a + 1;
    }
    i_1 = i_1 + 1;
  }
  bVar2 = (this->configDeleteFlags & 8) != 0;
  a_1 = 0;
  local_30 = 0;
  do {
    if ((7 < local_30) || (pMesh->mColors[a_1] == (aiColor4D *)0x0)) {
      if (((this->configDeleteFlags & 0x20) != 0) && (pMesh->mBones != (aiBone **)0x0)) {
        ArrayDelete<aiBone>(&pMesh->mBones,&pMesh->mNumBones);
        real._3_1_ = true;
      }
      return real._3_1_;
    }
    if (((this->configDeleteFlags & 1 << ((char)a_1 + 0x14U & 0x1f)) != 0) || (bVar2)) {
      if (pMesh->mColors[a_1] != (aiColor4D *)0x0) {
        operator_delete__(pMesh->mColors[a_1]);
      }
      pMesh->mColors[a_1] = (aiColor4D *)0x0;
      real._3_1_ = true;
      uVar1 = a_1;
      if (bVar2) goto LAB_005c1654;
      while (local_34 = uVar1 + 1, local_34 < 8) {
        pMesh->mColors[uVar1] = pMesh->mColors[local_34];
        uVar1 = local_34;
      }
      pMesh->mColors[7] = (aiColor4D *)0x0;
    }
    else {
LAB_005c1654:
      a_1 = a_1 + 1;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

bool RemoveVCProcess::ProcessMesh(aiMesh* pMesh)
{
    bool ret = false;

    // if all materials have been deleted let the material
    // index of the mesh point to the created default material
    if ( configDeleteFlags & aiComponent_MATERIALS)
        pMesh->mMaterialIndex = 0;

    // handle normals
    if (configDeleteFlags & aiComponent_NORMALS && pMesh->mNormals)
    {
        delete[] pMesh->mNormals;
        pMesh->mNormals = NULL;
        ret = true;
    }

    // handle tangents and bitangents
    if (configDeleteFlags & aiComponent_TANGENTS_AND_BITANGENTS && pMesh->mTangents)
    {
        delete[] pMesh->mTangents;
        pMesh->mTangents = NULL;

        delete[] pMesh->mBitangents;
        pMesh->mBitangents = NULL;
        ret = true;
    }

    // handle texture coordinates
    bool b = (0 != (configDeleteFlags & aiComponent_TEXCOORDS));
    for (unsigned int i = 0, real = 0; real < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++real)
    {
        if (!pMesh->mTextureCoords[i])break;
        if (configDeleteFlags & aiComponent_TEXCOORDSn(real) || b)
        {
            delete [] pMesh->mTextureCoords[i];
            pMesh->mTextureCoords[i] = NULL;
            ret = true;

            if (!b)
            {
                // collapse the rest of the array
                for (unsigned int a = i+1; a < AI_MAX_NUMBER_OF_TEXTURECOORDS;++a)
                    pMesh->mTextureCoords[a-1] = pMesh->mTextureCoords[a];

                pMesh->mTextureCoords[AI_MAX_NUMBER_OF_TEXTURECOORDS-1] = NULL;
                continue;
            }
        }
        ++i;
    }

    // handle vertex colors
    b = (0 != (configDeleteFlags & aiComponent_COLORS));
    for (unsigned int i = 0, real = 0; real < AI_MAX_NUMBER_OF_COLOR_SETS; ++real)
    {
        if (!pMesh->mColors[i])break;
        if (configDeleteFlags & aiComponent_COLORSn(i) || b)
        {
            delete [] pMesh->mColors[i];
            pMesh->mColors[i] = NULL;
            ret = true;

            if (!b)
            {
                // collapse the rest of the array
                for (unsigned int a = i+1; a < AI_MAX_NUMBER_OF_COLOR_SETS;++a)
                    pMesh->mColors[a-1] = pMesh->mColors[a];

                pMesh->mColors[AI_MAX_NUMBER_OF_COLOR_SETS-1] = NULL;
                continue;
            }
        }
        ++i;
    }

    // handle bones
    if (configDeleteFlags & aiComponent_BONEWEIGHTS && pMesh->mBones)
    {
        ArrayDelete(pMesh->mBones,pMesh->mNumBones);
        ret = true;
    }
    return ret;
}